

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptSymbol::GetDiagValueString
          (JavascriptSymbol *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  charcount_t countNeeded;
  PropertyRecord *pPVar1;
  char16 *str;
  ScriptContext *requestContext_local;
  StringBuilder<Memory::ArenaAllocator> *stringBuilder_local;
  JavascriptSymbol *this_local;
  
  pPVar1 = GetValue(this);
  if (pPVar1 != (PropertyRecord *)0x0) {
    StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<8ul>
              (stringBuilder,(char16 (*) [8])L"Symbol(");
    pPVar1 = GetValue(this);
    str = PropertyRecord::GetBuffer(pPVar1);
    pPVar1 = GetValue(this);
    countNeeded = PropertyRecord::GetLength(pPVar1);
    StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,str,countNeeded);
    StringBuilder<Memory::ArenaAllocator>::Append(stringBuilder,L')');
  }
  return 1;
}

Assistant:

BOOL JavascriptSymbol::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        if (this->GetValue())
        {
            stringBuilder->AppendCppLiteral(_u("Symbol("));
            stringBuilder->Append(this->GetValue()->GetBuffer(), this->GetValue()->GetLength());
            stringBuilder->Append(_u(')'));
        }
        return TRUE;
    }